

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAppender.h
# Opt level: O2

int32_t __thiscall
aeron::concurrent::logbuffer::TermAppender::appendUnfragmentedMessage
          (TermAppender *this,HeaderWriter *header,AtomicBuffer *srcBuffer,index_t srcOffset,
          index_t length,on_reserved_value_supplier_t *reservedValueSupplier,int32_t activeTermId)

{
  length_t termLength;
  int __args_1;
  int32_t iVar1;
  ulong uVar2;
  long v;
  int32_t frameOffset;
  uint uVar3;
  long lVar4;
  
  uVar3 = length + 0x3fU & 0xffffffe0;
  uVar2 = getAndAddRawTail(this,uVar3);
  termLength = this->m_termBuffer->m_length;
  iVar1 = (int32_t)(uVar2 >> 0x20);
  checkTerm(activeTermId,iVar1);
  lVar4 = (long)(int)uVar3 + (uVar2 & 0xffffffff);
  if ((int)termLength < lVar4) {
    iVar1 = handleEndOfLogCondition(this->m_termBuffer,uVar2 & 0xffffffff,header,termLength,iVar1);
    return iVar1;
  }
  uVar3 = length + 0x20;
  HeaderWriter::write(header,(int)this->m_termBuffer,(void *)(uVar2 & 0xffffffff),(ulong)uVar3);
  __args_1 = (int)uVar2;
  AtomicBuffer::putBytes(this->m_termBuffer,__args_1 + 0x20,srcBuffer,srcOffset,length);
  v = std::function<long_(aeron::concurrent::AtomicBuffer_&,_int,_int)>::operator()
                (reservedValueSupplier,this->m_termBuffer,__args_1,uVar3);
  AtomicBuffer::putInt64(this->m_termBuffer,__args_1 + 0x18,v);
  AtomicBuffer::putInt32Ordered(this->m_termBuffer,__args_1,uVar3);
  return (int32_t)lVar4;
}

Assistant:

inline std::int32_t appendUnfragmentedMessage(
        const HeaderWriter& header,
        const AtomicBuffer& srcBuffer,
        util::index_t srcOffset,
        util::index_t length,
        const on_reserved_value_supplier_t& reservedValueSupplier,
        std::int32_t activeTermId)
    {
        const util::index_t frameLength = length + DataFrameHeader::LENGTH;
        const util::index_t alignedLength = util::BitUtil::align(frameLength, FrameDescriptor::FRAME_ALIGNMENT);
        const std::int64_t rawTail = getAndAddRawTail(alignedLength);
        const std::int64_t termOffset = rawTail & 0xFFFFFFFF;
        const std::int32_t termId = LogBufferDescriptor::termId(rawTail);

        const std::int32_t termLength = m_termBuffer.capacity();

        checkTerm(activeTermId, termId);

        std::int64_t resultingOffset = termOffset + alignedLength;
        if (resultingOffset > termLength)
        {
            resultingOffset = handleEndOfLogCondition(m_termBuffer, termOffset, header, termLength, termId);
        }
        else
        {
            const std::int32_t frameOffset = static_cast<std::int32_t>(termOffset);
            header.write(m_termBuffer, frameOffset, frameLength, termId);
            m_termBuffer.putBytes(frameOffset + DataFrameHeader::LENGTH, srcBuffer, srcOffset, length);

            const std::int64_t reservedValue = reservedValueSupplier(m_termBuffer, frameOffset, frameLength);
            m_termBuffer.putInt64(frameOffset + DataFrameHeader::RESERVED_VALUE_FIELD_OFFSET, reservedValue);

            FrameDescriptor::frameLengthOrdered(m_termBuffer, frameOffset, frameLength);
        }

        return static_cast<std::int32_t>(resultingOffset);
    }